

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O1

int lj_ffh_string_rep(lua_State *L)

{
  bool bVar1;
  uint uVar2;
  GCstr *pGVar3;
  GCstr *pGVar4;
  void *pvVar5;
  ulong uVar6;
  long lVar7;
  MSize MVar8;
  uint uVar9;
  int32_t i;
  ulong uVar10;
  uint32_t uVar11;
  ulong uVar12;
  long lVar13;
  size_t lenx;
  uint uVar14;
  TValue *pTVar15;
  GCstr *pGVar16;
  
  pGVar3 = lj_lib_checkstr(L,1);
  uVar2 = lj_lib_checkint(L,2);
  if ((L->base + 2 < L->top) && (*(int *)((long)L->base + 0x14) != -1)) {
    pGVar4 = lj_lib_checkstr(L,3);
  }
  else {
    pGVar4 = (GCstr *)0x0;
  }
  uVar9 = (L->glref).ptr32;
  uVar12 = (ulong)uVar9;
  if (0 < (int)uVar2) {
    uVar14 = pGVar3->len;
    if (pGVar4 == (GCstr *)0x0) {
      lenx = (long)(int)uVar14 * (ulong)uVar2;
    }
    else {
      lVar13 = (ulong)pGVar4->len + (long)(int)uVar14;
      if (0x7fffff00 < lVar13) goto LAB_00144d06;
      lenx = lVar13 * (ulong)uVar2;
    }
    if (0x7fffff00 < (long)lenx) {
LAB_00144d06:
      lj_err_caller(L,LJ_ERR_STROV);
    }
    if (lenx != 0) {
      uVar9 = (uint)lenx;
      if (*(uint *)(uVar12 + 100) < uVar9) {
        MVar8 = 0x20;
        if (0x20 < uVar9) {
          MVar8 = uVar9;
        }
        pvVar5 = lj_mem_realloc(L,*(void **)(uVar12 + 0x58),*(uint *)(uVar12 + 100),MVar8);
        *(void **)(uVar12 + 0x58) = pvVar5;
        *(MSize *)(uVar12 + 100) = MVar8;
      }
      pGVar16 = pGVar3 + 1;
      lVar13 = *(long *)(uVar12 + 0x58);
      uVar9 = uVar2;
      if (pGVar4 != (GCstr *)0x0) {
        lenx = lenx - pGVar4->len;
        uVar9 = 1;
        if (uVar2 != 1) {
          if (0 < (int)uVar14) {
            uVar6 = 0;
            do {
              *(undefined1 *)(lVar13 + uVar6) =
                   *(undefined1 *)((long)&(pGVar16->nextgc).gcptr32 + uVar6);
              uVar6 = uVar6 + 1;
            } while (uVar14 != uVar6);
            lVar13 = lVar13 + uVar6;
          }
          MVar8 = pGVar4->len;
          if (0 < (long)(int)MVar8) {
            lVar7 = 0;
            do {
              *(undefined1 *)(lVar13 + lVar7) =
                   *(undefined1 *)((long)&pGVar4[1].nextgc.gcptr32 + lVar7);
              lVar7 = lVar7 + 1;
            } while ((int)MVar8 != lVar7);
            lVar13 = lVar13 + lVar7;
          }
          pGVar16 = *(GCstr **)(uVar12 + 0x58);
          uVar14 = MVar8 + pGVar3->len;
          uVar9 = uVar2 - 1;
        }
      }
      uVar6 = 1;
      if (1 < (int)uVar14) {
        uVar6 = (ulong)uVar14;
      }
      do {
        uVar10 = 0;
        do {
          *(undefined1 *)(lVar13 + uVar10) =
               *(undefined1 *)((long)&(pGVar16->nextgc).gcptr32 + uVar10);
          uVar10 = uVar10 + 1;
        } while (uVar6 != uVar10);
        lVar13 = lVar13 + uVar10;
        bVar1 = 1 < (int)uVar9;
        uVar9 = uVar9 - 1;
      } while (bVar1);
      pTVar15 = L->base;
      pGVar3 = lj_str_new(L,*(char **)(uVar12 + 0x58),lenx);
      uVar11 = (uint32_t)pGVar3;
      goto LAB_00144cd1;
    }
  }
  pTVar15 = L->base;
  uVar11 = uVar9 + 0x80;
LAB_00144cd1:
  pTVar15[-1].u32.lo = uVar11;
  *(undefined4 *)((long)pTVar15 + -4) = 0xfffffffb;
  return 2;
}

Assistant:

LJLIB_ASM(string_rep)
{
  GCstr *s = lj_lib_checkstr(L, 1);
  int32_t k = lj_lib_checkint(L, 2);
  GCstr *sep = lj_lib_optstr(L, 3);
  int32_t len = (int32_t)s->len;
  global_State *g = G(L);
  int64_t tlen;
  const char *src;
  char *buf;
  if (k <= 0) {
  empty:
    setstrV(L, L->base-1, &g->strempty);
    return FFH_RES(1);
  }
  if (sep) {
    tlen = (int64_t)len + sep->len;
    if (tlen > LJ_MAX_STR)
      lj_err_caller(L, LJ_ERR_STROV);
    tlen *= k;
    if (tlen > LJ_MAX_STR)
      lj_err_caller(L, LJ_ERR_STROV);
  } else {
    tlen = (int64_t)k * len;
    if (tlen > LJ_MAX_STR)
      lj_err_caller(L, LJ_ERR_STROV);
  }
  if (tlen == 0) goto empty;
  buf = lj_str_needbuf(L, &g->tmpbuf, (MSize)tlen);
  src = strdata(s);
  if (sep) {
    tlen -= sep->len;  /* Ignore trailing separator. */
    if (k > 1) {  /* Paste one string and one separator. */
      int32_t i;
      i = 0; while (i < len) *buf++ = src[i++];
      src = strdata(sep); len = sep->len;
      i = 0; while (i < len) *buf++ = src[i++];
      src = g->tmpbuf.buf; len += s->len; k--;  /* Now copy that k-1 times. */
    }
  }
  do {
    int32_t i = 0;
    do { *buf++ = src[i++]; } while (i < len);
  } while (--k > 0);
  setstrV(L, L->base-1, lj_str_new(L, g->tmpbuf.buf, (size_t)tlen));
  return FFH_RES(1);
}